

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<false,false,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  
  if ((long)*(int *)(this + 0x14) < 1) {
    dVar3 = 0.0;
  }
  else {
    auVar5 = ZEXT816(0);
    lVar2 = 0;
    do {
      fVar6 = *(float *)(*(long *)(this + 0xf8) + lVar2 * 4) /
              *(float *)(*(long *)(this + 0xf0) + lVar2 * 4);
      auVar7._0_8_ = (double)(fVar6 * fVar6);
      auVar7._8_8_ = 0;
      auVar4._0_8_ = (double)auVar5._0_4_;
      auVar4._8_8_ = auVar5._8_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x78) + lVar2 * 8);
      auVar1 = vfmadd231sd_fma(auVar4,auVar7,auVar1);
      auVar5._0_4_ = (float)auVar1._0_8_;
      auVar5._4_12_ = auVar1._4_12_;
      lVar2 = lVar2 + 1;
    } while (*(int *)(this + 0x14) != lVar2);
    dVar3 = (double)auVar5._0_4_;
  }
  *outSumSquaredDerivatives = dVar3;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}